

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sym_tbl.cpp
# Opt level: O2

shared_ptr<mocker::ast::Declaration> __thiscall
mocker::SymTbl::lookUp(SymTbl *this,ScopeID *scopeID,string *identifier)

{
  iterator iVar1;
  key_type *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ast::Declaration> sVar2;
  shared_ptr<mocker::SymTbl::Scope> cur;
  __shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  getScope((SymTbl *)&local_48,scopeID);
  do {
    if (local_48._M_ptr == (element_type *)0x0) {
      (this->root).super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->root).super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0018342a:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
      sVar2.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      sVar2.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<mocker::ast::Declaration>)
             sVar2.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>;
    }
    iVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_48._M_ptr,in_RCX);
    if (iVar1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      std::__shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)iVar1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_true>
                        ._M_cur + 0x28));
      goto LAB_0018342a;
    }
    std::__shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,&(local_48._M_ptr)->pnt);
    std::__shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_48,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  } while( true );
}

Assistant:

std::shared_ptr<ast::Declaration>
SymTbl::lookUp(const ScopeID &scopeID, const std::string &identifier) const {
  auto cur = getScope(scopeID);
  while (cur != nullptr) {
    auto iter = cur->syms.find(identifier);
    if (iter != cur->syms.end())
      return {iter->second};
    cur = cur->pnt.lock();
  }
  return {};
}